

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O0

int NGA_Sprs_array_count_sketch(int s_a,int size_k,int *g_k,int *g_w)

{
  Integer IVar1;
  undefined4 *in_RCX;
  undefined4 *in_RDX;
  int ret;
  Integer gw;
  Integer gk;
  Integer size;
  Integer sa;
  Integer in_stack_00000200;
  Integer *in_stack_00000208;
  Integer *in_stack_00000210;
  Integer in_stack_00000218;
  Integer in_stack_00000220;
  undefined4 local_38;
  undefined4 local_30;
  
  IVar1 = pnga_sprs_array_count_sketch
                    (in_stack_00000220,in_stack_00000218,in_stack_00000210,in_stack_00000208,
                     in_stack_00000200);
  *in_RDX = local_30;
  *in_RCX = local_38;
  return (int)IVar1;
}

Assistant:

int NGA_Sprs_array_count_sketch(int s_a, int size_k, int *g_k, int *g_w)
{
  Integer sa = (Integer)s_a;
  Integer size = (Integer)size_k;
  Integer gk;
  Integer gw;
  int ret = (int)wnga_sprs_array_count_sketch(sa, size, &gk, &gw, 1);
  *g_k = (int)gk;
  *g_w = (int)gw;
  return ret;
}